

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_outputBufferGetPythonFile(PyObject *self,PyObject *args)

{
  PyObject *op;
  int iVar1;
  undefined8 *local_40;
  xmlOutputBufferPtr obj;
  PyObject *file;
  PyObject *buffer;
  PyObject *args_local;
  PyObject *self_local;
  
  buffer = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:outputBufferGetPythonFile",&file);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (file == (PyObject *)&_Py_NoneStruct) {
      local_40 = (undefined8 *)0x0;
    }
    else {
      local_40 = (undefined8 *)file[1].ob_refcnt;
    }
    if (local_40 == (undefined8 *)0x0) {
      fprintf(_stderr,"outputBufferGetPythonFile: obj == NULL\n");
      _Py_INCREF((PyObject *)&_Py_NoneStruct);
      self_local = (PyObject *)&_Py_NoneStruct;
    }
    else if ((code *)local_40[2] == xmlPythonFileClose) {
      op = (PyObject *)*local_40;
      if (op == (PyObject *)0x0) {
        _Py_INCREF((PyObject *)&_Py_NoneStruct);
        self_local = (PyObject *)&_Py_NoneStruct;
      }
      else {
        _Py_INCREF(op);
        self_local = op;
      }
    }
    else {
      fprintf(_stderr,"outputBufferGetPythonFile: not a python file wrapper\n");
      _Py_INCREF((PyObject *)&_Py_NoneStruct);
      self_local = (PyObject *)&_Py_NoneStruct;
    }
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_outputBufferGetPythonFile(ATTRIBUTE_UNUSED PyObject *self,
                                    PyObject *args) {
    PyObject *buffer;
    PyObject *file;
    xmlOutputBufferPtr obj;

    if (!PyArg_ParseTuple(args, (char *)"O:outputBufferGetPythonFile",
			  &buffer))
	return(NULL);

    obj = PyoutputBuffer_Get(buffer);
    if (obj == NULL) {
	fprintf(stderr,
	        "outputBufferGetPythonFile: obj == NULL\n");
	Py_INCREF(Py_None);
	return(Py_None);
    }
    if (obj->closecallback != xmlPythonFileClose) {
	fprintf(stderr,
	        "outputBufferGetPythonFile: not a python file wrapper\n");
	Py_INCREF(Py_None);
	return(Py_None);
    }
    file = (PyObject *) obj->context;
    if (file == NULL) {
	Py_INCREF(Py_None);
	return(Py_None);
    }
    Py_INCREF(file);
    return(file);
}